

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int AddByteToTrackInBits(uchar *track,uint index,uchar byte,int size,int totalSize)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar uVar8;
  uint uVar9;
  
  uVar3 = (ulong)index;
  if (track == (uchar *)0x0) {
    return index + size;
  }
  uVar2 = (long)totalSize - 1;
  if (index != 0) {
    uVar2 = (ulong)(index - 1);
  }
  uVar8 = track[uVar2];
  uVar5 = 0;
  uVar6 = 1;
  uVar7 = 7;
  do {
    iVar1 = (int)uVar3;
    if (size <= (int)(uVar6 - 1)) {
      return iVar1;
    }
    if ((byte >> (uVar7 & 0x1f) & 1) == 0) {
      uVar2 = (ulong)(iVar1 + 1);
      track[uVar3] = uVar8 == '\0';
      uVar9 = uVar5 | 1;
      if ((int)uVar6 < size) {
        uVar4 = '\0';
        goto LAB_00152956;
      }
    }
    else {
      uVar2 = (ulong)(iVar1 + 1);
      track[uVar3] = '\0';
      uVar4 = '\x01';
      uVar9 = uVar6;
      if ((int)uVar6 < size) {
LAB_00152956:
        track[uVar2] = uVar4;
      }
    }
    uVar3 = uVar2;
    if ((int)uVar9 < size) {
      uVar3 = (ulong)((int)uVar2 + 1);
      uVar8 = track[uVar2];
    }
    uVar5 = uVar5 + 2;
    uVar6 = uVar6 + 2;
    uVar7 = uVar7 - 1;
  } while( true );
}

Assistant:

int AddByteToTrackInBits(unsigned char* track, unsigned int index, unsigned char byte, int size, int totalSize)
{
   if (track == nullptr)
      return index + (size);

   unsigned char previous_bit;
   if (index > 0)
   {
      previous_bit = track[index - 1];
   }
   else
   {
      previous_bit = track[totalSize - 1];
   }

   for (int i = 0; i < size; i += 2)
   {
      // Get bit
      unsigned char c = ((byte >> (7 - (i / 2))) & 0x01);

      if (c == 1)
      {
         track[index++] = 0;
         if (i + 1 < size)
            track[index] = 1;
      }
      else
      {
         track[index++] = (previous_bit == 0) ? 1 : 0;
         if (i + 1 < size)
            track[index] = 0;
      }
      if (i + 1 < size)
         previous_bit = track[index++];
   }
   return index;
}